

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreePrevious(BtCursor *pCur,int *pRes)

{
  char cVar1;
  uint uVar2;
  MemPage *pMVar3;
  int iVar4;
  
  *pRes = 0;
  pCur->curFlags = pCur->curFlags & 0xf1;
  (pCur->info).nSize = 0;
  if (pCur->eState == '\x01') {
    cVar1 = pCur->iPage;
    if ((pCur->aiIdx[cVar1] != 0) && (pCur->apPage[cVar1]->leaf != '\0')) {
      pCur->aiIdx[cVar1] = pCur->aiIdx[cVar1] - 1;
      return 0;
    }
  }
  if (pCur->eState != 1) {
    iVar4 = 0;
    if (2 < pCur->eState) {
      iVar4 = btreeRestoreCursorPosition(pCur);
    }
    if (iVar4 != 0) {
      return iVar4;
    }
    if (pCur->eState == '\0') {
LAB_00139e63:
      *pRes = 1;
      return 0;
    }
    iVar4 = pCur->skipNext;
    if (iVar4 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (iVar4 < 0) {
        return 0;
      }
    }
  }
  pMVar3 = pCur->apPage[pCur->iPage];
  if (pMVar3->leaf == '\0') {
    uVar2 = *(uint *)(pMVar3->aData +
                     (CONCAT11(pMVar3->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2],
                               pMVar3->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2 + 1]) &
                     pMVar3->maskPage));
    iVar4 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18);
    if (iVar4 == 0) {
      iVar4 = moveToRightmost(pCur);
      return iVar4;
    }
  }
  else {
    while( true ) {
      cVar1 = pCur->iPage;
      if (pCur->aiIdx[cVar1] != 0) break;
      if (cVar1 == '\0') {
        pCur->eState = '\0';
        goto LAB_00139e63;
      }
      (pCur->info).nSize = 0;
      pCur->curFlags = pCur->curFlags & 0xf9;
      pCur->iPage = cVar1 + -1;
      sqlite3PagerUnrefNotNull(pCur->apPage[cVar1]->pDbPage);
    }
    pCur->aiIdx[cVar1] = pCur->aiIdx[cVar1] - 1;
    iVar4 = 0;
    if ((pCur->apPage[cVar1]->intKey != '\0') && (iVar4 = 0, pCur->apPage[cVar1]->leaf == '\0')) {
      iVar4 = sqlite3BtreePrevious(pCur,pRes);
      return iVar4;
    }
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int *pRes){
  assert( cursorOwnsBtShared(pCur) );
  assert( pRes!=0 );
  assert( *pRes==0 || *pRes==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  *pRes = 0;
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey);
  pCur->info.nSize = 0;
  if( pCur->eState!=CURSOR_VALID
   || pCur->aiIdx[pCur->iPage]==0
   || pCur->apPage[pCur->iPage]->leaf==0
  ){
    return btreePrevious(pCur, pRes);
  }
  pCur->aiIdx[pCur->iPage]--;
  return SQLITE_OK;
}